

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase172::run(TestCase172 *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  char (*pacVar3) [4];
  __pid_t _Var4;
  void *pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TransformPromiseNodeBase *pTVar6;
  TransformPromiseNodeBase *this_00;
  bool bVar7;
  Promise<kj::StringPtr> promise2;
  Promise<int> promise;
  int line;
  WaitScope waitScope;
  DebugComparison<const_char_(&)[4],_kj::StringPtr> _kjCondition;
  EventLoop loop;
  OwnPromiseNode local_150;
  OwnPromiseNode local_148;
  undefined4 local_13c;
  char *local_138;
  EventLoop *local_130;
  undefined4 local_128;
  long local_120;
  undefined8 uStack_118;
  char *local_110;
  char *pcStack_108;
  undefined8 local_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  StringPtr local_e0;
  DebugComparison<const_char_(&)[4],_kj::StringPtr> local_d0;
  EventLoop local_a0;
  
  EventLoop::EventLoop(&local_a0);
  local_128 = 0xffffffff;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = &local_a0;
  EventLoop::enterScope(&local_a0);
  yield();
  pacVar3 = local_d0.left;
  pPVar1 = *(PromiseArena **)((long)local_d0.left + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_d0.left - (long)pPVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    pTVar6 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:177:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00625c90;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(PromiseArena **)((long)local_d0.left + 8) = (PromiseArena *)0x0;
    pTVar6 = (TransformPromiseNodeBase *)
             &((PromiseArenaMember *)((long)local_d0.left + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:177:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pacVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00625c90;
    ((PromiseArenaMember *)((long)pacVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1
    ;
  }
  pacVar3 = local_d0.left;
  local_148.ptr = &pTVar6->super_PromiseNode;
  if ((PromiseArenaMember *)local_d0.left != (PromiseArenaMember *)0x0) {
    local_d0.left = (char (*) [4])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pacVar3);
  }
  OVar2.ptr = local_148.ptr;
  local_13c = 0xb1;
  pPVar1 = ((local_148.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_148.ptr - (long)pPVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    pTVar6 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_148,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:180:46)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00625ce8;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    ((local_148.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar6 = (TransformPromiseNodeBase *)((OwnPromiseNode *)(local_148.ptr + -3) + 1);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_148,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:180:46)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((OwnPromiseNode *)(OVar2.ptr + -3))[1] = (OwnPromiseNode)&PTR_destroy_00625ce8;
    (((TransformPromiseNodeBase *)(OVar2.ptr + -2))->super_PromiseNode).super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  pPVar1 = (pTVar6->super_PromiseNode).super_PromiseArenaMember.arena;
  local_150.ptr = &pTVar6->super_PromiseNode;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)pTVar6 - (long)pPVar1) < 0x30) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_150,
               kj::_::
               TransformPromiseNode<kj::StringPtr,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:183:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:184:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d0) = &PTR_destroy_00625d40;
    *(undefined4 **)((long)pvVar5 + 0x3f8) = &local_13c;
    *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
  }
  else {
    (pTVar6->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&pTVar6[-2].dependency;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_150,
               kj::_::
               TransformPromiseNode<kj::StringPtr,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:183:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:184:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    pTVar6[-2].dependency.ptr = (PromiseNode *)&PTR_destroy_00625d40;
    pTVar6[-1].continuationTracePtr = &local_13c;
    pTVar6[-2].continuationTracePtr = pPVar1;
  }
  OVar2.ptr = local_150.ptr;
  bVar7 = (TransformPromiseNodeBase *)local_150.ptr != (TransformPromiseNodeBase *)0x0;
  local_150.ptr = &this_00->super_PromiseNode;
  if (bVar7) {
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  local_138 = "baz";
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_f0 = "run";
  local_e8 = 0x2c000000ba;
  _Var4 = Promise<kj::StringPtr>::wait((Promise<kj::StringPtr> *)&local_150,&local_130);
  local_e0.content.ptr = (char *)CONCAT44(extraout_var,_Var4);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_d0,(DebugExpression<char_const(&)[4]> *)&local_138,&local_e0);
  if ((local_d0.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_108 = "run";
    local_100 = 0x2c000000ba;
    _Var4 = Promise<kj::StringPtr>::wait((Promise<kj::StringPtr> *)&local_150,&local_130);
    local_e0.content.ptr = (char *)CONCAT44(extraout_var_00,_Var4);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],kj::StringPtr>&,char_const(&)[4],kj::StringPtr>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (promise2.wait(waitScope))\", _kjCondition, \"baz\", promise2.wait(waitScope)"
               ,(char (*) [55])"failed: expected (\"baz\") == (promise2.wait(waitScope))",&local_d0,
               (char (*) [4])0x4c8534,&local_e0);
  }
  OVar2.ptr = local_150.ptr;
  if ((TransformPromiseNodeBase *)local_150.ptr != (TransformPromiseNodeBase *)0x0) {
    local_150.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_148.ptr;
  if ((TransformPromiseNodeBase *)local_148.ptr != (TransformPromiseNodeBase *)0x0) {
    local_148.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  if (local_120 == 0) {
    EventLoop::leaveScope(local_130);
  }
  EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Async, PropagateExceptionTypeChange) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  Promise<StringPtr> promise2 = promise.then([](int i) -> StringPtr { return "foo"; });

  promise2 = promise2.then(
      [](StringPtr s) -> StringPtr { return "bar"; },
      [&](Exception&& e) -> StringPtr { EXPECT_EQ(line, e.getLine()); return "baz"; });

  EXPECT_EQ("baz", promise2.wait(waitScope));
}